

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O0

Nm_Entry_t * Nm_ManTableLookupName(Nm_Man_t *p,char *pName,int Type)

{
  Nm_Entry_t **ppNVar1;
  uint uVar2;
  int iVar3;
  Nm_Entry_t *local_38;
  Nm_Entry_t *pTemp;
  Nm_Entry_t *pEntry;
  int Type_local;
  char *pName_local;
  Nm_Man_t *p_local;
  
  ppNVar1 = p->pBinsN2I;
  uVar2 = Nm_HashString(pName,p->nBins);
  pTemp = ppNVar1[uVar2];
  while( true ) {
    if (pTemp == (Nm_Entry_t *)0x0) {
      return (Nm_Entry_t *)0x0;
    }
    iVar3 = strcmp((char *)(pTemp + 1),pName);
    if ((iVar3 == 0) && ((Type == -1 || (pTemp->Type == Type)))) break;
    if (pTemp->pNameSake != (Nm_Entry_t *)0x0) {
      for (local_38 = pTemp->pNameSake; local_38 != pTemp; local_38 = local_38->pNameSake) {
        iVar3 = strcmp((char *)(local_38 + 1),pName);
        if ((iVar3 == 0) && ((Type == -1 || (local_38->Type == Type)))) {
          return local_38;
        }
      }
    }
    pTemp = pTemp->pNextN2I;
  }
  return pTemp;
}

Assistant:

Nm_Entry_t * Nm_ManTableLookupName( Nm_Man_t * p, char * pName, int Type )
{
    Nm_Entry_t * pEntry, * pTemp;
    for ( pEntry = p->pBinsN2I[ Nm_HashString(pName, p->nBins) ]; pEntry; pEntry = pEntry->pNextN2I )
    {
        // check the entry itself
        if ( !strcmp(pEntry->Name, pName) && (Type == -1 || pEntry->Type == (unsigned)Type) )
            return pEntry;
        // if there is no namesakes, continue
        if ( pEntry->pNameSake == NULL )
            continue;
        // check the list of namesakes
        for ( pTemp = pEntry->pNameSake; pTemp != pEntry; pTemp = pTemp->pNameSake )
            if ( !strcmp(pTemp->Name, pName) && (Type == -1 || pTemp->Type == (unsigned)Type) )
                return pTemp;
    }
    return NULL;
}